

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_K256_ECDSA.c
# Opt level: O2

void point_mul_g(uint64_t *out,uint64_t *scalar)

{
  uint64_t *px;
  uint64_t tmp [15];
  uint64_t local_a8 [15];
  
  out[4] = 0;
  out[5] = 0;
  out[8] = 0;
  out[9] = 0;
  out[6] = 0;
  out[7] = 0;
  out[2] = 0;
  out[3] = 0;
  *out = 0;
  out[1] = 0;
  out[5] = 1;
  out[10] = 0;
  out[0xb] = 0;
  out[0xe] = 0;
  out[0xc] = 0;
  out[0xd] = 0;
  local_a8[0xc] = 0;
  local_a8[0xd] = 0;
  local_a8[10] = 0;
  local_a8[0xb] = 0;
  local_a8[8] = 0;
  local_a8[9] = 0;
  local_a8[6] = 0;
  local_a8[7] = 0;
  local_a8[4] = 0;
  local_a8[5] = 0;
  local_a8[2] = 0;
  local_a8[3] = 0;
  local_a8[0] = 0;
  local_a8[1] = 0;
  local_a8[0xe] = 0;
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  precomp_get_consttime
            (Hacl_K256_PrecompTable_precomp_g_pow2_192_table_w4,scalar[3] >> 0x3c,local_a8);
  Hacl_Impl_K256_PointAdd_point_add(out,out,local_a8);
  precomp_get_consttime
            (Hacl_K256_PrecompTable_precomp_g_pow2_128_table_w4,scalar[2] >> 0x3c,local_a8);
  Hacl_Impl_K256_PointAdd_point_add(out,out,local_a8);
  precomp_get_consttime
            (Hacl_K256_PrecompTable_precomp_g_pow2_64_table_w4,scalar[1] >> 0x3c,local_a8);
  Hacl_Impl_K256_PointAdd_point_add(out,out,local_a8);
  precomp_get_consttime(Hacl_K256_PrecompTable_precomp_basepoint_table_w4,*scalar >> 0x3c,local_a8);
  Hacl_Impl_K256_PointAdd_point_add(out,out,local_a8);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  precomp_get_consttime
            (Hacl_K256_PrecompTable_precomp_g_pow2_192_table_w4,
             (ulong)(*(byte *)((long)scalar + 0x1f) & 0xf),local_a8);
  Hacl_Impl_K256_PointAdd_point_add(out,out,local_a8);
  precomp_get_consttime
            (Hacl_K256_PrecompTable_precomp_g_pow2_128_table_w4,
             (ulong)(*(byte *)((long)scalar + 0x17) & 0xf),local_a8);
  Hacl_Impl_K256_PointAdd_point_add(out,out,local_a8);
  precomp_get_consttime
            (Hacl_K256_PrecompTable_precomp_g_pow2_64_table_w4,
             (ulong)(*(byte *)((long)scalar + 0xf) & 0xf),local_a8);
  Hacl_Impl_K256_PointAdd_point_add(out,out,local_a8);
  precomp_get_consttime
            (Hacl_K256_PrecompTable_precomp_basepoint_table_w4,
             (ulong)(*(byte *)((long)scalar + 7) & 0xf),local_a8);
  Hacl_Impl_K256_PointAdd_point_add(out,out,local_a8);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  precomp_get_consttime
            (Hacl_K256_PrecompTable_precomp_g_pow2_192_table_w4,
             (ulong)((uint)(scalar[3] >> 0x34) & 0xf),local_a8);
  Hacl_Impl_K256_PointAdd_point_add(out,out,local_a8);
  precomp_get_consttime
            (Hacl_K256_PrecompTable_precomp_g_pow2_128_table_w4,
             (ulong)((uint)(scalar[2] >> 0x34) & 0xf),local_a8);
  Hacl_Impl_K256_PointAdd_point_add(out,out,local_a8);
  precomp_get_consttime
            (Hacl_K256_PrecompTable_precomp_g_pow2_64_table_w4,
             (ulong)((uint)(scalar[1] >> 0x34) & 0xf),local_a8);
  Hacl_Impl_K256_PointAdd_point_add(out,out,local_a8);
  precomp_get_consttime
            (Hacl_K256_PrecompTable_precomp_basepoint_table_w4,
             (ulong)((uint)(*scalar >> 0x34) & 0xf),local_a8);
  Hacl_Impl_K256_PointAdd_point_add(out,out,local_a8);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  precomp_get_consttime
            (Hacl_K256_PrecompTable_precomp_g_pow2_192_table_w4,
             (ulong)(*(ushort *)((long)scalar + 0x1e) & 0xf),local_a8);
  Hacl_Impl_K256_PointAdd_point_add(out,out,local_a8);
  precomp_get_consttime
            (Hacl_K256_PrecompTable_precomp_g_pow2_128_table_w4,
             (ulong)(*(ushort *)((long)scalar + 0x16) & 0xf),local_a8);
  Hacl_Impl_K256_PointAdd_point_add(out,out,local_a8);
  precomp_get_consttime
            (Hacl_K256_PrecompTable_precomp_g_pow2_64_table_w4,
             (ulong)(*(ushort *)((long)scalar + 0xe) & 0xf),local_a8);
  Hacl_Impl_K256_PointAdd_point_add(out,out,local_a8);
  precomp_get_consttime
            (Hacl_K256_PrecompTable_precomp_basepoint_table_w4,
             (ulong)(*(ushort *)((long)scalar + 6) & 0xf),local_a8);
  Hacl_Impl_K256_PointAdd_point_add(out,out,local_a8);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  precomp_get_consttime
            (Hacl_K256_PrecompTable_precomp_g_pow2_192_table_w4,
             (ulong)((uint)(scalar[3] >> 0x2c) & 0xf),local_a8);
  Hacl_Impl_K256_PointAdd_point_add(out,out,local_a8);
  precomp_get_consttime
            (Hacl_K256_PrecompTable_precomp_g_pow2_128_table_w4,
             (ulong)((uint)(scalar[2] >> 0x2c) & 0xf),local_a8);
  Hacl_Impl_K256_PointAdd_point_add(out,out,local_a8);
  precomp_get_consttime
            (Hacl_K256_PrecompTable_precomp_g_pow2_64_table_w4,
             (ulong)((uint)(scalar[1] >> 0x2c) & 0xf),local_a8);
  Hacl_Impl_K256_PointAdd_point_add(out,out,local_a8);
  precomp_get_consttime
            (Hacl_K256_PrecompTable_precomp_basepoint_table_w4,
             (ulong)((uint)(*scalar >> 0x2c) & 0xf),local_a8);
  Hacl_Impl_K256_PointAdd_point_add(out,out,local_a8);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  precomp_get_consttime
            (Hacl_K256_PrecompTable_precomp_g_pow2_192_table_w4,
             (ulong)((uint)(scalar[3] >> 0x28) & 0xf),local_a8);
  Hacl_Impl_K256_PointAdd_point_add(out,out,local_a8);
  precomp_get_consttime
            (Hacl_K256_PrecompTable_precomp_g_pow2_128_table_w4,
             (ulong)((uint)(scalar[2] >> 0x28) & 0xf),local_a8);
  Hacl_Impl_K256_PointAdd_point_add(out,out,local_a8);
  precomp_get_consttime
            (Hacl_K256_PrecompTable_precomp_g_pow2_64_table_w4,
             (ulong)((uint)(scalar[1] >> 0x28) & 0xf),local_a8);
  Hacl_Impl_K256_PointAdd_point_add(out,out,local_a8);
  precomp_get_consttime
            (Hacl_K256_PrecompTable_precomp_basepoint_table_w4,
             (ulong)((uint)(*scalar >> 0x28) & 0xf),local_a8);
  Hacl_Impl_K256_PointAdd_point_add(out,out,local_a8);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  precomp_get_consttime
            (Hacl_K256_PrecompTable_precomp_g_pow2_192_table_w4,
             (ulong)((uint)(scalar[3] >> 0x24) & 0xf),local_a8);
  Hacl_Impl_K256_PointAdd_point_add(out,out,local_a8);
  precomp_get_consttime
            (Hacl_K256_PrecompTable_precomp_g_pow2_128_table_w4,
             (ulong)((uint)(scalar[2] >> 0x24) & 0xf),local_a8);
  Hacl_Impl_K256_PointAdd_point_add(out,out,local_a8);
  precomp_get_consttime
            (Hacl_K256_PrecompTable_precomp_g_pow2_64_table_w4,
             (ulong)((uint)(scalar[1] >> 0x24) & 0xf),local_a8);
  Hacl_Impl_K256_PointAdd_point_add(out,out,local_a8);
  precomp_get_consttime
            (Hacl_K256_PrecompTable_precomp_basepoint_table_w4,
             (ulong)((uint)(*scalar >> 0x24) & 0xf),local_a8);
  Hacl_Impl_K256_PointAdd_point_add(out,out,local_a8);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  precomp_get_consttime
            (Hacl_K256_PrecompTable_precomp_g_pow2_192_table_w4,
             (ulong)(*(uint *)((long)scalar + 0x1c) & 0xf),local_a8);
  Hacl_Impl_K256_PointAdd_point_add(out,out,local_a8);
  precomp_get_consttime
            (Hacl_K256_PrecompTable_precomp_g_pow2_128_table_w4,
             (ulong)(*(uint *)((long)scalar + 0x14) & 0xf),local_a8);
  Hacl_Impl_K256_PointAdd_point_add(out,out,local_a8);
  precomp_get_consttime
            (Hacl_K256_PrecompTable_precomp_g_pow2_64_table_w4,
             (ulong)(*(uint *)((long)scalar + 0xc) & 0xf),local_a8);
  Hacl_Impl_K256_PointAdd_point_add(out,out,local_a8);
  precomp_get_consttime
            (Hacl_K256_PrecompTable_precomp_basepoint_table_w4,
             (ulong)(*(uint *)((long)scalar + 4) & 0xf),local_a8);
  Hacl_Impl_K256_PointAdd_point_add(out,out,local_a8);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  precomp_get_consttime
            (Hacl_K256_PrecompTable_precomp_g_pow2_192_table_w4,(ulong)((uint)scalar[3] >> 0x1c),
             local_a8);
  Hacl_Impl_K256_PointAdd_point_add(out,out,local_a8);
  precomp_get_consttime
            (Hacl_K256_PrecompTable_precomp_g_pow2_128_table_w4,(ulong)((uint)scalar[2] >> 0x1c),
             local_a8);
  Hacl_Impl_K256_PointAdd_point_add(out,out,local_a8);
  precomp_get_consttime
            (Hacl_K256_PrecompTable_precomp_g_pow2_64_table_w4,(ulong)((uint)scalar[1] >> 0x1c),
             local_a8);
  Hacl_Impl_K256_PointAdd_point_add(out,out,local_a8);
  precomp_get_consttime
            (Hacl_K256_PrecompTable_precomp_basepoint_table_w4,(ulong)((uint)*scalar >> 0x1c),
             local_a8);
  Hacl_Impl_K256_PointAdd_point_add(out,out,local_a8);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  precomp_get_consttime
            (Hacl_K256_PrecompTable_precomp_g_pow2_192_table_w4,
             (ulong)(*(byte *)((long)scalar + 0x1b) & 0xf),local_a8);
  Hacl_Impl_K256_PointAdd_point_add(out,out,local_a8);
  precomp_get_consttime
            (Hacl_K256_PrecompTable_precomp_g_pow2_128_table_w4,
             (ulong)(*(byte *)((long)scalar + 0x13) & 0xf),local_a8);
  Hacl_Impl_K256_PointAdd_point_add(out,out,local_a8);
  precomp_get_consttime
            (Hacl_K256_PrecompTable_precomp_g_pow2_64_table_w4,
             (ulong)(*(byte *)((long)scalar + 0xb) & 0xf),local_a8);
  Hacl_Impl_K256_PointAdd_point_add(out,out,local_a8);
  precomp_get_consttime
            (Hacl_K256_PrecompTable_precomp_basepoint_table_w4,
             (ulong)(*(byte *)((long)scalar + 3) & 0xf),local_a8);
  Hacl_Impl_K256_PointAdd_point_add(out,out,local_a8);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  precomp_get_consttime
            (Hacl_K256_PrecompTable_precomp_g_pow2_192_table_w4,
             (ulong)((uint)scalar[3] >> 0x14 & 0xf),local_a8);
  Hacl_Impl_K256_PointAdd_point_add(out,out,local_a8);
  precomp_get_consttime
            (Hacl_K256_PrecompTable_precomp_g_pow2_128_table_w4,
             (ulong)((uint)scalar[2] >> 0x14 & 0xf),local_a8);
  Hacl_Impl_K256_PointAdd_point_add(out,out,local_a8);
  precomp_get_consttime
            (Hacl_K256_PrecompTable_precomp_g_pow2_64_table_w4,
             (ulong)((uint)scalar[1] >> 0x14 & 0xf),local_a8);
  Hacl_Impl_K256_PointAdd_point_add(out,out,local_a8);
  precomp_get_consttime
            (Hacl_K256_PrecompTable_precomp_basepoint_table_w4,(ulong)((uint)*scalar >> 0x14 & 0xf),
             local_a8);
  Hacl_Impl_K256_PointAdd_point_add(out,out,local_a8);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  precomp_get_consttime
            (Hacl_K256_PrecompTable_precomp_g_pow2_192_table_w4,
             (ulong)(*(ushort *)((long)scalar + 0x1a) & 0xf),local_a8);
  Hacl_Impl_K256_PointAdd_point_add(out,out,local_a8);
  precomp_get_consttime
            (Hacl_K256_PrecompTable_precomp_g_pow2_128_table_w4,
             (ulong)(*(ushort *)((long)scalar + 0x12) & 0xf),local_a8);
  Hacl_Impl_K256_PointAdd_point_add(out,out,local_a8);
  precomp_get_consttime
            (Hacl_K256_PrecompTable_precomp_g_pow2_64_table_w4,
             (ulong)(*(ushort *)((long)scalar + 10) & 0xf),local_a8);
  Hacl_Impl_K256_PointAdd_point_add(out,out,local_a8);
  precomp_get_consttime
            (Hacl_K256_PrecompTable_precomp_basepoint_table_w4,
             (ulong)(*(ushort *)((long)scalar + 2) & 0xf),local_a8);
  Hacl_Impl_K256_PointAdd_point_add(out,out,local_a8);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  precomp_get_consttime
            (Hacl_K256_PrecompTable_precomp_g_pow2_192_table_w4,
             (ulong)((uint)scalar[3] >> 0xc & 0xf),local_a8);
  Hacl_Impl_K256_PointAdd_point_add(out,out,local_a8);
  precomp_get_consttime
            (Hacl_K256_PrecompTable_precomp_g_pow2_128_table_w4,
             (ulong)((uint)scalar[2] >> 0xc & 0xf),local_a8);
  Hacl_Impl_K256_PointAdd_point_add(out,out,local_a8);
  precomp_get_consttime
            (Hacl_K256_PrecompTable_precomp_g_pow2_64_table_w4,(ulong)((uint)scalar[1] >> 0xc & 0xf)
             ,local_a8);
  Hacl_Impl_K256_PointAdd_point_add(out,out,local_a8);
  precomp_get_consttime
            (Hacl_K256_PrecompTable_precomp_basepoint_table_w4,(ulong)((uint)*scalar >> 0xc & 0xf),
             local_a8);
  Hacl_Impl_K256_PointAdd_point_add(out,out,local_a8);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  precomp_get_consttime
            (Hacl_K256_PrecompTable_precomp_g_pow2_192_table_w4,(ulong)((uint)scalar[3] >> 8 & 0xf),
             local_a8);
  Hacl_Impl_K256_PointAdd_point_add(out,out,local_a8);
  precomp_get_consttime
            (Hacl_K256_PrecompTable_precomp_g_pow2_128_table_w4,(ulong)((uint)scalar[2] >> 8 & 0xf),
             local_a8);
  Hacl_Impl_K256_PointAdd_point_add(out,out,local_a8);
  precomp_get_consttime
            (Hacl_K256_PrecompTable_precomp_g_pow2_64_table_w4,(ulong)((uint)scalar[1] >> 8 & 0xf),
             local_a8);
  Hacl_Impl_K256_PointAdd_point_add(out,out,local_a8);
  precomp_get_consttime
            (Hacl_K256_PrecompTable_precomp_basepoint_table_w4,(ulong)((uint)*scalar >> 8 & 0xf),
             local_a8);
  Hacl_Impl_K256_PointAdd_point_add(out,out,local_a8);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  precomp_get_consttime
            (Hacl_K256_PrecompTable_precomp_g_pow2_192_table_w4,(ulong)((uint)scalar[3] >> 4 & 0xf),
             local_a8);
  Hacl_Impl_K256_PointAdd_point_add(out,out,local_a8);
  precomp_get_consttime
            (Hacl_K256_PrecompTable_precomp_g_pow2_128_table_w4,(ulong)((uint)scalar[2] >> 4 & 0xf),
             local_a8);
  Hacl_Impl_K256_PointAdd_point_add(out,out,local_a8);
  precomp_get_consttime
            (Hacl_K256_PrecompTable_precomp_g_pow2_64_table_w4,(ulong)((uint)scalar[1] >> 4 & 0xf),
             local_a8);
  Hacl_Impl_K256_PointAdd_point_add(out,out,local_a8);
  precomp_get_consttime
            (Hacl_K256_PrecompTable_precomp_basepoint_table_w4,(ulong)((uint)*scalar >> 4 & 0xf),
             local_a8);
  Hacl_Impl_K256_PointAdd_point_add(out,out,local_a8);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  precomp_get_consttime
            (Hacl_K256_PrecompTable_precomp_g_pow2_192_table_w4,(ulong)((uint)scalar[3] & 0xf),
             local_a8);
  Hacl_Impl_K256_PointAdd_point_add(out,out,local_a8);
  precomp_get_consttime
            (Hacl_K256_PrecompTable_precomp_g_pow2_128_table_w4,(ulong)((uint)scalar[2] & 0xf),
             local_a8);
  Hacl_Impl_K256_PointAdd_point_add(out,out,local_a8);
  precomp_get_consttime
            (Hacl_K256_PrecompTable_precomp_g_pow2_64_table_w4,(ulong)((uint)scalar[1] & 0xf),
             local_a8);
  Hacl_Impl_K256_PointAdd_point_add(out,out,local_a8);
  precomp_get_consttime
            (Hacl_K256_PrecompTable_precomp_basepoint_table_w4,(ulong)((uint)*scalar & 0xf),local_a8
            );
  Hacl_Impl_K256_PointAdd_point_add(out,out,local_a8);
  return;
}

Assistant:

static inline void point_mul_g(uint64_t *out, uint64_t *scalar)
{
  uint64_t q1[15U] = { 0U };
  uint64_t *gx = q1;
  uint64_t *gy = q1 + 5U;
  uint64_t *gz = q1 + 10U;
  gx[0U] = 0x2815b16f81798ULL;
  gx[1U] = 0xdb2dce28d959fULL;
  gx[2U] = 0xe870b07029bfcULL;
  gx[3U] = 0xbbac55a06295cULL;
  gx[4U] = 0x79be667ef9dcULL;
  gy[0U] = 0x7d08ffb10d4b8ULL;
  gy[1U] = 0x48a68554199c4ULL;
  gy[2U] = 0xe1108a8fd17b4ULL;
  gy[3U] = 0xc4655da4fbfc0ULL;
  gy[4U] = 0x483ada7726a3ULL;
  memset(gz, 0U, 5U * sizeof (uint64_t));
  gz[0U] = 1ULL;
  uint64_t
  q2[15U] =
    {
      4496295042185355ULL, 3125448202219451ULL, 1239608518490046ULL, 2687445637493112ULL,
      77979604880139ULL, 3360310474215011ULL, 1216410458165163ULL, 177901593587973ULL,
      3209978938104985ULL, 118285133003718ULL, 434519962075150ULL, 1114612377498854ULL,
      3488596944003813ULL, 450716531072892ULL, 66044973203836ULL
    };
  KRML_MAYBE_UNUSED_VAR(q2);
  uint64_t
  q3[15U] =
    {
      1277614565900951ULL, 378671684419493ULL, 3176260448102880ULL, 1575691435565077ULL,
      167304528382180ULL, 2600787765776588ULL, 7497946149293ULL, 2184272641272202ULL,
      2200235265236628ULL, 265969268774814ULL, 1913228635640715ULL, 2831959046949342ULL,
      888030405442963ULL, 1817092932985033ULL, 101515844997121ULL
    };
  KRML_MAYBE_UNUSED_VAR(q3);
  uint64_t
  q4[15U] =
    {
      34056422761564ULL, 3315864838337811ULL, 3797032336888745ULL, 2580641850480806ULL,
      208048944042500ULL, 1233795288689421ULL, 1048795233382631ULL, 646545158071530ULL,
      1816025742137285ULL, 12245672982162ULL, 2119364213800870ULL, 2034960311715107ULL,
      3172697815804487ULL, 4185144850224160ULL, 2792055915674ULL
    };
  KRML_MAYBE_UNUSED_VAR(q4);
  uint64_t *r1 = scalar;
  uint64_t *r2 = scalar + 1U;
  uint64_t *r3 = scalar + 2U;
  uint64_t *r4 = scalar + 3U;
  Hacl_Impl_K256_Point_make_point_at_inf(out);
  uint64_t tmp[15U] = { 0U };
  KRML_MAYBE_FOR16(i,
    0U,
    16U,
    1U,
    KRML_MAYBE_FOR4(i0, 0U, 4U, 1U, Hacl_Impl_K256_PointDouble_point_double(out, out););
    uint32_t k = 64U - 4U * i - 4U;
    uint64_t bits_l = Hacl_Bignum_Lib_bn_get_bits_u64(1U, r4, k, 4U);
    precomp_get_consttime(Hacl_K256_PrecompTable_precomp_g_pow2_192_table_w4, bits_l, tmp);
    Hacl_Impl_K256_PointAdd_point_add(out, out, tmp);
    uint32_t k0 = 64U - 4U * i - 4U;
    uint64_t bits_l0 = Hacl_Bignum_Lib_bn_get_bits_u64(1U, r3, k0, 4U);
    precomp_get_consttime(Hacl_K256_PrecompTable_precomp_g_pow2_128_table_w4, bits_l0, tmp);
    Hacl_Impl_K256_PointAdd_point_add(out, out, tmp);
    uint32_t k1 = 64U - 4U * i - 4U;
    uint64_t bits_l1 = Hacl_Bignum_Lib_bn_get_bits_u64(1U, r2, k1, 4U);
    precomp_get_consttime(Hacl_K256_PrecompTable_precomp_g_pow2_64_table_w4, bits_l1, tmp);
    Hacl_Impl_K256_PointAdd_point_add(out, out, tmp);
    uint32_t k2 = 64U - 4U * i - 4U;
    uint64_t bits_l2 = Hacl_Bignum_Lib_bn_get_bits_u64(1U, r1, k2, 4U);
    precomp_get_consttime(Hacl_K256_PrecompTable_precomp_basepoint_table_w4, bits_l2, tmp);
    Hacl_Impl_K256_PointAdd_point_add(out, out, tmp););
}